

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_rkv.c
# Opt level: O0

MPP_RET jpegd_gen_regs(JpegdHalCtx *ctx,JpegdSyntax *syntax)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  RockchipSocType RVar5;
  RK_U32 offset;
  uint local_6c;
  RK_U32 table_fd;
  RK_U8 start_byte;
  RK_U32 hw_strm_offset;
  RK_U32 strm_offset;
  RK_U32 uv_hor_virstride;
  RK_U32 y_virstride;
  RK_U32 y_hor_stride;
  RK_U32 out_height;
  RK_U32 out_width;
  JpegRegSet_conflict1 *regs;
  JpegdSyntax *s;
  MPP_RET ret;
  JpegdSyntax *syntax_local;
  JpegdHalCtx *ctx_local;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","enter\n","jpegd_gen_regs");
  }
  pvVar1 = ctx->regs;
  *(uint *)((long)pvVar1 + 4) = *(uint *)((long)pvVar1 + 4) & 0xfffffffe | 1;
  *(uint *)((long)pvVar1 + 4) = *(uint *)((long)pvVar1 + 4) & 0xfffffffb | 4;
  *(uint *)((long)pvVar1 + 4) = *(uint *)((long)pvVar1 + 4) & 0xfffffff7 | 8;
  *(uint *)((long)pvVar1 + 0xc) =
       *(uint *)((long)pvVar1 + 0xc) & 0xffff0000 | syntax->width - 1 & 0xffff;
  *(uint *)((long)pvVar1 + 0xc) =
       *(uint *)((long)pvVar1 + 0xc) & 0xffff | (syntax->height - 1) * 0x10000;
  if ((syntax->sample_precision == '\b') && (syntax->qtbl_entry < 4)) {
    *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xffffff8f;
    if (syntax->nb_components == 1) {
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xffffcfff | 0x1000;
    }
    if (syntax->nb_components < 2) {
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xfffffcff | 0x100;
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xffffcfff | 0x1000;
    }
    else {
      iVar4 = 2;
      if (1 < syntax->qtbl_entry) {
        iVar4 = 3;
      }
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xfffffcff | iVar4 << 8;
      iVar4 = 2;
      if (0xf < syntax->htbl_entry) {
        iVar4 = 3;
      }
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xffffcfff | iVar4 << 0xc;
    }
    if (syntax->restart_interval != 0) {
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xffff7fff | 0x8000;
      *(uint *)((long)pvVar1 + 0x10) =
           *(uint *)((long)pvVar1 + 0x10) & 0xffff | (syntax->restart_interval - 1) * 0x10000;
    }
    switch(syntax->yuv_mode) {
    case 0:
    case 2:
    case 3:
      *(uint *)((long)pvVar1 + 0x10) =
           *(uint *)((long)pvVar1 + 0x10) & 0xfffffff8 | syntax->yuv_mode & 7;
      break;
    default:
      _mpp_log_l(2,"hal_jpegd_rkv","unsupported yuv mode %d\n","jpegd_gen_regs",
                 (ulong)syntax->yuv_mode);
      break;
    case 4:
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xfffffff8 | 5;
      break;
    case 5:
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xfffffff8 | 4;
      break;
    case 6:
      *(uint *)((long)pvVar1 + 0x10) = *(uint *)((long)pvVar1 + 0x10) & 0xfffffff8 | 1;
    }
    uVar2 = ((syntax->width + 0xf & 0xfffffff0) >> ((byte)(*(uint *)((long)pvVar1 + 8) >> 0xc) & 3))
            + 0xf;
    if ((*(uint *)((long)pvVar1 + 8) >> 0x18 & 1) == 0) {
      local_6c = syntax->height + 7 & 0xfffffff8;
    }
    else {
      local_6c = syntax->height + 0xf & 0xfffffff0;
    }
    local_6c = local_6c >> ((byte)(*(uint *)((long)pvVar1 + 8) >> 0xc) & 3);
    if ((jpegd_debug & 0x80) != 0) {
      _mpp_log_l(4,"hal_jpegd_rkv","output scale %d, width %d, height %d\n",(char *)0x0,
                 (ulong)(*(uint *)((long)pvVar1 + 8) >> 0xc & 3),(ulong)(uVar2 & 0xfffffff0),
                 local_6c);
    }
    uv_hor_virstride = uVar2 >> 4;
    hw_strm_offset = 0;
    switch(*(uint *)((long)pvVar1 + 8) >> 0x1b & 7) {
    case 0:
      uVar3 = *(uint *)((long)pvVar1 + 0x10) & 7;
      if (uVar3 == 0) {
        hw_strm_offset = 0;
      }
      else if (uVar3 == 1) {
        hw_strm_offset = uVar2 >> 5;
      }
      else {
        hw_strm_offset = uv_hor_virstride;
        if (uVar3 == 4 || uVar3 == 5) {
          hw_strm_offset = uv_hor_virstride << 1;
        }
      }
      break;
    case 1:
      uv_hor_virstride = uv_hor_virstride * 3;
      break;
    case 2:
    case 4:
      uv_hor_virstride = uv_hor_virstride << 1;
      break;
    case 3:
      hw_strm_offset = uv_hor_virstride;
    }
    iVar4 = uv_hor_virstride * local_6c;
    if ((*(uint *)((long)pvVar1 + 8) >> 0x1a & 1) == 1) {
      RVar5 = mpp_get_soc_type();
      if (RVar5 < ROCKCHIP_SOC_RK3576) {
        uv_hor_virstride = uv_hor_virstride << 3;
        hw_strm_offset = hw_strm_offset << 3;
      }
      else {
        uVar2 = *(uint *)((long)pvVar1 + 8) >> 0x1b & 7;
        if (uVar2 == 0) {
          switch(*(uint *)((long)pvVar1 + 0x10) & 7) {
          case 0:
            uv_hor_virstride = uv_hor_virstride << 2;
            break;
          case 1:
          case 2:
            uv_hor_virstride = uv_hor_virstride * 0xc >> 1;
            break;
          case 3:
          case 4:
            uv_hor_virstride = uv_hor_virstride << 3;
            break;
          case 5:
            uv_hor_virstride = uv_hor_virstride * 0xc;
            break;
          default:
            return MPP_NOK;
          }
        }
        else if (uVar2 == 3) {
          uv_hor_virstride = uv_hor_virstride * 0xc >> 1;
        }
        else if (uVar2 == 4) {
          uv_hor_virstride = uv_hor_virstride << 3;
        }
        hw_strm_offset = 0;
      }
    }
    *(uint *)((long)pvVar1 + 0x14) =
         *(uint *)((long)pvVar1 + 0x14) & 0xffff0000 | uv_hor_virstride & 0xffff;
    *(uint *)((long)pvVar1 + 0x14) =
         *(uint *)((long)pvVar1 + 0x14) & 0xffff | hw_strm_offset << 0x10;
    *(uint *)((long)pvVar1 + 0x18) = *(uint *)((long)pvVar1 + 0x18) & 0xf | iVar4 * 0x10;
    *(uint *)((long)pvVar1 + 0x1c) =
         *(uint *)((long)pvVar1 + 0x1c) & 0xfeffffff | (uv_hor_virstride >> 0x10 & 1) << 0x18;
    if (syntax->qtable_cnt == '\0') {
      *(uint *)((long)pvVar1 + 0x1c) = *(uint *)((long)pvVar1 + 0x1c) & 0xffffffe0;
    }
    else {
      *(uint *)((long)pvVar1 + 0x1c) =
           *(uint *)((long)pvVar1 + 0x1c) & 0xffffffe0 |
           (*(uint *)((long)pvVar1 + 0x10) >> 8 & 3) * 8 - 1 & 0x1f;
    }
    *(uint *)((long)pvVar1 + 0x1c) =
         *(uint *)((long)pvVar1 + 0x1c) & 0xffc0ffff |
         ((*(uint *)((long)pvVar1 + 0x10) >> 0xc & 3) *
          ((uint)((*(uint *)((long)pvVar1 + 0x10) >> 4 & 7) != 0) * 4 + 0xc) - 1 & 0x3f) << 0x10;
    switch(*(uint *)((long)pvVar1 + 0x10) >> 0xc & 3) {
    case 0:
      *(uint *)((long)pvVar1 + 0x1c) = *(uint *)((long)pvVar1 + 0x1c) & 0xffffe0ff;
      *(uint *)((long)pvVar1 + 0x1c) = *(uint *)((long)pvVar1 + 0x1c) & 0xffc0ffff;
      break;
    case 1:
    case 3:
      *(uint *)((long)pvVar1 + 0x1c) =
           *(uint *)((long)pvVar1 + 0x1c) & 0xffffe0ff | (syntax->nb_components * 6 - 1 & 0x1f) << 8
      ;
      break;
    case 2:
      *(uint *)((long)pvVar1 + 0x1c) =
           *(uint *)((long)pvVar1 + 0x1c) & 0xffffe0ff |
           ((syntax->nb_components - 1) * 6 - 1 & 0x1f) << 8;
      break;
    default:
      _mpp_log_l(2,"hal_jpegd_rkv","unsupported htable_sel %d\n","jpegd_gen_regs",
                 (ulong)(*(uint *)((long)pvVar1 + 0x10) >> 0xc & 3));
    }
    iVar4 = mpp_buffer_get_fd_with_caller(ctx->pTableBase,"jpegd_gen_regs");
    if (iVar4 == 0) {
      _mpp_log_l(2,"hal_jpegd_rkv","get table_fd failed\n","jpegd_gen_regs");
      ctx_local._4_4_ = MPP_NOK;
    }
    else {
      uVar2 = syntax->strm_offset;
      offset = uVar2 - (uVar2 & 0xf);
      *(uint *)((long)pvVar1 + 0x20) =
           *(uint *)((long)pvVar1 + 0x20) & 0xf |
           ((syntax->pkt_len - offset) + 0xf & 0xfffffff0) - 0x10;
      *(uint *)((long)pvVar1 + 0x20) =
           *(uint *)((long)pvVar1 + 0x20) & 0xfffffff0 | (uint)((byte)uVar2 & 0xf);
      *(int *)((long)pvVar1 + 0x24) = iVar4;
      *(int *)((long)pvVar1 + 0x28) = iVar4;
      *(int *)((long)pvVar1 + 0x2c) = iVar4;
      *(RK_S32 *)((long)pvVar1 + 0x34) = ctx->frame_fd;
      *(RK_S32 *)((long)pvVar1 + 0x30) = ctx->pkt_fd;
      mpp_dev_set_reg_offset(ctx->dev,0xc,offset);
      mpp_dev_set_reg_offset(ctx->dev,10,0x180);
      mpp_dev_set_reg_offset(ctx->dev,0xb,0x2c0);
      *(uint *)((long)pvVar1 + 0x38) = *(uint *)((long)pvVar1 + 0x38) & 0xfffffffe | 1;
      *(uint *)((long)pvVar1 + 0x38) = *(uint *)((long)pvVar1 + 0x38) & 0xffffff9f | 0x40;
      *(uint *)((long)pvVar1 + 0x38) = *(uint *)((long)pvVar1 + 0x38) & 0xfffffe7f | 0x100;
      *(uint *)((long)pvVar1 + 0x38) = *(uint *)((long)pvVar1 + 0x38) & 0xfffffdff;
      *(undefined4 *)((long)pvVar1 + 0x40) = 0xff;
      *(uint *)((long)pvVar1 + 0x78) = *(uint *)((long)pvVar1 + 0x78) & 0xfffffffe | 1;
      *(uint *)((long)pvVar1 + 0x78) = *(uint *)((long)pvVar1 + 0x78) & 0xfffffffd | 2;
      *(uint *)((long)pvVar1 + 0x78) = *(uint *)((long)pvVar1 + 0x78) & 0xfffffff7 | 8;
      *(uint *)((long)pvVar1 + 0x78) = *(uint *)((long)pvVar1 + 0x78) & 0xffffff0f | 0xa0;
      jpegd_write_rkv_htbl(ctx,syntax);
      jpegd_write_rkv_qtbl(ctx,syntax);
      if ((jpegd_debug & 1) != 0) {
        _mpp_log_l(4,"hal_jpegd_rkv","exit\n","jpegd_gen_regs");
      }
      ctx_local._4_4_ = MPP_OK;
    }
  }
  else {
    ctx_local._4_4_ = MPP_NOK;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET jpegd_gen_regs(JpegdHalCtx *ctx, JpegdSyntax *syntax)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;
    JpegdSyntax *s = syntax;
    JpegRegSet *regs = (JpegRegSet *)ctx->regs;

    regs->reg1_int.dec_e = 1;
    regs->reg1_int.dec_timeout_e = 1;
    regs->reg1_int.buf_empty_e = 1;

    regs->reg3_pic_size.pic_width_m1 = s->width - 1;
    regs->reg3_pic_size.pic_height_m1 = s->height - 1;

    if (s->sample_precision != DCT_SAMPLE_PRECISION_8 || s->qtbl_entry > TBL_ENTRY_3)
        return MPP_NOK;

    regs->reg4_pic_fmt.pixel_depth = BIT_DEPTH_8;
    if (s->nb_components == 1) {
        regs->reg4_pic_fmt.htables_sel = TBL_ENTRY_1;
    }

    if (s->nb_components > 1) {
        regs->reg4_pic_fmt.qtables_sel = (s->qtbl_entry > 1) ? TBL_ENTRY_3 : TBL_ENTRY_2;
        regs->reg4_pic_fmt.htables_sel = (s->htbl_entry > 0x0f) ? TBL_ENTRY_3 : TBL_ENTRY_2;
    } else {
        regs->reg4_pic_fmt.qtables_sel = TBL_ENTRY_1;
        regs->reg4_pic_fmt.htables_sel = TBL_ENTRY_1;
    }

    if (s->restart_interval) {
        regs->reg4_pic_fmt.dri_e = RST_ENABLE;
        regs->reg4_pic_fmt.dri_mcu_num_m1 = s->restart_interval - 1;
    }

    switch (s->yuv_mode) {
    case JPEGDEC_YUV400:
    case JPEGDEC_YUV420:
    case JPEGDEC_YUV422:
        regs->reg4_pic_fmt.jpeg_mode = s->yuv_mode;
        break;
    case JPEGDEC_YUV411:
        regs->reg4_pic_fmt.jpeg_mode = YUV_MODE_411;
        break;
    case JPEGDEC_YUV440:
        regs->reg4_pic_fmt.jpeg_mode = YUV_MODE_440;
        break;
    case JPEGDEC_YUV444:
        regs->reg4_pic_fmt.jpeg_mode = YUV_MODE_444;
        break;
    default:
        mpp_err_f("unsupported yuv mode %d\n", s->yuv_mode);
        break;
    }

    RK_U32 out_width = MPP_ALIGN(s->width, 16);
    RK_U32 out_height = s->height;
    out_width = out_width >> regs->reg2_sys.scaledown_mode;
    out_width = MPP_ALIGN(out_width, 16);
    out_height = regs->reg2_sys.fill_down_e ? MPP_ALIGN(out_height, 16) : MPP_ALIGN(out_height, 8);
    out_height = out_height >> regs->reg2_sys.scaledown_mode;
    jpegd_dbg_hal("output scale %d, width %d, height %d\n", regs->reg2_sys.scaledown_mode, out_width, out_height);

    RK_U32 y_hor_stride = out_width >> 4;
    RK_U32 y_virstride = 0;
    RK_U32 uv_hor_virstride = 0;

    switch (regs->reg2_sys.yuv_out_format) {
    case YUV_OUT_FMT_2_RGB888:
        y_hor_stride *= 3;
        break;
    case YUV_OUT_FMT_2_RGB565:
    case YUV_OUT_FMT_2_YUYV:
        y_hor_stride *= 2;
        break;
    case YUV_OUT_FMT_NO_TRANS:
        switch (regs->reg4_pic_fmt.jpeg_mode) {
        case YUV_MODE_440:
        case YUV_MODE_444:
            uv_hor_virstride = y_hor_stride * 2;
            break;
        case YUV_MODE_411:
            uv_hor_virstride = y_hor_stride >> 1;
            break;
        case YUV_MODE_400:
            uv_hor_virstride = 0;
            break;
        default:
            uv_hor_virstride = y_hor_stride;
            break;
        }
        break;
    case YUV_OUT_FMT_2_NV12:
        uv_hor_virstride = y_hor_stride;
        break;
    }

    y_virstride = y_hor_stride * out_height;
    if (regs->reg2_sys.dec_out_sequence == OUTPUT_TILE) {
        // The new JPEG decoder supports tile 4x4 output by default.
        if (mpp_get_soc_type() >= ROCKCHIP_SOC_RK3576) {
            switch (regs->reg2_sys.yuv_out_format) {
            case YUV_OUT_FMT_2_YUYV:
                y_hor_stride = y_hor_stride * 4 * 2;
                break;
            case YUV_OUT_FMT_NO_TRANS:
                switch (regs->reg4_pic_fmt.jpeg_mode) {
                case YUV_MODE_422:
                case YUV_MODE_440:
                    y_hor_stride = y_hor_stride * 4 * 2;
                    break;
                case YUV_MODE_444:
                    y_hor_stride = y_hor_stride * 4 * 3;
                    break;
                case YUV_MODE_411:
                case YUV_MODE_420:
                    y_hor_stride = y_hor_stride * 4 * 3 / 2;
                    break;
                case YUV_MODE_400:
                    y_hor_stride = y_hor_stride * 4;
                    break;
                default:
                    return MPP_NOK;
                    break;
                }
                break;
            case YUV_OUT_FMT_2_NV12:
                y_hor_stride = y_hor_stride * 4 * 3 / 2;
                break;
            }

            uv_hor_virstride = 0;
        } else {
            y_hor_stride <<= 3;
            uv_hor_virstride <<= 3;
        }
    }

    regs->reg5_hor_virstride.y_hor_virstride = y_hor_stride & 0xffff;
    regs->reg5_hor_virstride.uv_hor_virstride = uv_hor_virstride & 0xffff;
    regs->reg6_y_virstride.y_virstride = y_virstride;

    regs->reg7_tbl_len.y_hor_virstride_h = (y_hor_stride >> 16) & 1;

    if (s->qtable_cnt)
        regs->reg7_tbl_len.qtbl_len = regs->reg4_pic_fmt.qtables_sel * 8 - 1;
    else
        regs->reg7_tbl_len.qtbl_len = 0;

    // 8 bit precision 12, 12 bit precision 16;
    regs->reg7_tbl_len.htbl_value_len = regs->reg4_pic_fmt.htables_sel * (regs->reg4_pic_fmt.pixel_depth ? 16 : 12) - 1;

    switch (regs->reg4_pic_fmt.htables_sel) {
    case TBL_ENTRY_0 :
        regs->reg7_tbl_len.htbl_mincode_len = 0;
        regs->reg7_tbl_len.htbl_value_len = 0;
        break;
    case TBL_ENTRY_2 :
        regs->reg7_tbl_len.htbl_mincode_len = (s->nb_components - 1) * 6 - 1;
        break;
    case TBL_ENTRY_1 :
    case TBL_ENTRY_3 :
        regs->reg7_tbl_len.htbl_mincode_len = s->nb_components * 6 - 1;
        break;
    default :
        mpp_err_f("unsupported htable_sel %d\n", regs->reg4_pic_fmt.htables_sel);
        break;
    }

    RK_U32 strm_offset = 0;
    RK_U32 hw_strm_offset = 0;
    RK_U8 start_byte = 0;
    RK_U32 table_fd = mpp_buffer_get_fd(ctx->pTableBase);

    if (table_fd <= 0) {
        mpp_err_f("get table_fd failed\n");
        return MPP_NOK;
    }

    strm_offset = s->strm_offset;
    hw_strm_offset = strm_offset - strm_offset % 16;
    start_byte = strm_offset % 16;

    regs->reg8_strm_len.stream_len = (MPP_ALIGN((s->pkt_len - hw_strm_offset), 16) - 1) >> 4;
    regs->reg8_strm_len.strm_start_byte = start_byte;

    regs->reg9_qtbl_base = table_fd;
    regs->reg10_htbl_mincode_base = table_fd;
    regs->reg11_htbl_value_base = table_fd;
    regs->reg13_dec_out_base = ctx->frame_fd;
    regs->reg12_strm_base = ctx->pkt_fd;

    mpp_dev_set_reg_offset(ctx->dev, 12, hw_strm_offset);
    mpp_dev_set_reg_offset(ctx->dev, 10, RKD_HUFFMAN_MINCODE_TBL_OFFSET);
    mpp_dev_set_reg_offset(ctx->dev, 11, RKD_HUFFMAN_VALUE_TBL_OFFSET);

    regs->reg14_strm_error.error_prc_mode = 1;
    regs->reg14_strm_error.strm_ffff_err_mode = 2;
    regs->reg14_strm_error.strm_other_mark_mode = 2;
    regs->reg14_strm_error.strm_dri_seq_err_mode = 0;

    regs->reg16_clk_gate.val = 0xff;

    regs->reg30_perf_latency_ctrl0.axi_per_work_e = 1;
    regs->reg30_perf_latency_ctrl0.axi_per_clr_e = 1;
    regs->reg30_perf_latency_ctrl0.axi_cnt_type = 1;
    regs->reg30_perf_latency_ctrl0.rd_latency_id = 0xa;

    jpegd_write_rkv_htbl(ctx, s);

    jpegd_write_rkv_qtbl(ctx, s);

    jpegd_dbg_func("exit\n");
    return ret;
}